

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  size_type __n;
  value_type this_00;
  char *pcVar4;
  const_reference pvVar5;
  reference pvVar6;
  int __c;
  Iterator *b;
  Iterator IVar7;
  int has_bit_index;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  allocator<unsigned_int> local_25;
  value_type_conflict3 local_24;
  undefined1 local_1d;
  int local_1c;
  MessageGenerator *pMStack_18;
  int array_size;
  MessageGenerator *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *masks;
  
  pMStack_18 = this;
  this_local = (MessageGenerator *)__return_storage_ptr__;
  sVar3 = HasBitsSize(this);
  local_1c = (int)sVar3;
  local_1d = 0;
  __n = (size_type)local_1c;
  local_24 = 0;
  std::allocator<unsigned_int>::allocator(&local_25);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_24,&local_25);
  std::allocator<unsigned_int>::~allocator(&local_25);
  __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
  IVar7 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar7.descriptor;
  __end3.descriptor._0_4_ = IVar7.idx;
  IVar7 = FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar7.descriptor;
  field._0_4_ = IVar7.idx;
  while( true ) {
    b = (Iterator *)&field;
    bVar2 = cpp::operator!=((Iterator *)&__end3.descriptor,b);
    if (!bVar2) break;
    this_00 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        ((Iterator *)&__end3.descriptor);
    bVar2 = FieldDescriptor::is_required(this_00);
    if (bVar2) {
      pcVar4 = FieldDescriptor::index(this_00,(char *)b,__c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->has_bit_indices_,(long)(int)pcVar4);
      iVar1 = *pvVar5;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(long)(iVar1 / 0x20));
      *pvVar6 = 1 << ((byte)((long)iVar1 % 0x20) & 0x1f) | *pvVar6;
    }
    FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32_t> masks(array_size, 0);

  for (auto field : FieldRange(descriptor_)) {
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |= static_cast<uint32_t>(1)
                                 << (has_bit_index % 32);
  }
  return masks;
}